

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

RegexMatcher * Catch::Matchers::Matches(string *regex,Choice caseSensitivity)

{
  string *in_RSI;
  RegexMatcher *in_RDI;
  RegexMatcher *regex_00;
  RegexMatcher *this;
  
  this = (RegexMatcher *)&stack0xffffffffffffffc8;
  regex_00 = in_RDI;
  std::__cxx11::string::string((string *)this,in_RSI);
  StdString::RegexMatcher::RegexMatcher(this,(string *)regex_00,(Choice)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

StdString::RegexMatcher Matches(std::string const& regex, CaseSensitive::Choice caseSensitivity) {
        return StdString::RegexMatcher(regex, caseSensitivity);
    }